

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O0

void __thiscall amrex::MLNodeLinOp::MLNodeLinOp(MLNodeLinOp *this)

{
  MLLinOp *in_RDI;
  IntVect local_c;
  
  MLLinOp::MLLinOp(in_RDI);
  in_RDI->_vptr_MLLinOp = (_func_int **)&PTR__MLNodeLinOp_01aa66a8;
  std::unique_ptr<amrex::iMultiFab,std::default_delete<amrex::iMultiFab>>::
  unique_ptr<std::default_delete<amrex::iMultiFab>,void>
            ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)in_RDI);
  std::unique_ptr<amrex::iMultiFab,std::default_delete<amrex::iMultiFab>>::
  unique_ptr<std::default_delete<amrex::iMultiFab>,void>
            ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)in_RDI);
  Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  ::Vector((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
            *)0x191eda5);
  Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::Vector((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
            *)0x191edb6);
  Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::Vector((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
            *)0x191edc7);
  Vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
  ::Vector((Vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
            *)0x191edd8);
  MultiFab::MultiFab((MultiFab *)in_RDI);
  MultiFab::MultiFab((MultiFab *)in_RDI);
  Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::Vector((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
            *)0x191ee0b);
  *(undefined4 *)&in_RDI[2].m_needs_coarse_data_for_bc = 1;
  *(undefined1 *)&in_RDI[2].m_coarse_data_crse_ratio = 0;
  *(undefined1 *)((long)&in_RDI[2].m_coarse_data_crse_ratio + 1) = 0;
  *(undefined1 *)((long)&in_RDI[2].m_coarse_data_crse_ratio + 2) = 0;
  *(undefined4 *)in_RDI[2].m_coarse_bc_loc.vect = 2;
  *(undefined1 *)((long)in_RDI[2].m_coarse_bc_loc.vect + 4) = 1;
  IntVect::IntVect(&local_c,1);
  *(undefined8 *)(in_RDI->m_ixtype).vect = local_c.vect._0_8_;
  (in_RDI->m_ixtype).vect[2] = local_c.vect[2];
  return;
}

Assistant:

MLNodeLinOp::MLNodeLinOp ()
{
    m_ixtype = IntVect::TheNodeVector();
}